

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

bool __thiscall fasttext::FastText::checkModel(FastText *this,istream *in)

{
  char *in_RSI;
  long in_RDI;
  int32_t magic;
  int local_1c;
  char *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  std::istream::read(in_RSI,(long)&local_1c);
  if (local_1c == 0x2f4f16ba) {
    std::istream::read(local_18,in_RDI + 0x9c);
    if (*(int *)(in_RDI + 0x9c) < 0xd) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool FastText::checkModel(std::istream& in) {
	int32_t magic;
	in.read((char*)&(magic), sizeof(int32_t));
	if (magic != FASTTEXT_FILEFORMAT_MAGIC_INT32) {
		return false;
	}
	in.read((char*)&(version), sizeof(int32_t));
	if (version > FASTTEXT_VERSION) {
		return false;
	}
	return true;
}